

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_ArgsMerge::test_method(util_ArgsMerge *this)

{
  Span<unsigned_char> output;
  Span<const_unsigned_char> s;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  char *out_path;
  FILE *out_file;
  string out_sha_hex;
  uchar out_sha_bytes [32];
  CHash256 out_sha;
  char *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  lazy_ostream *in_stack_fffffffffffffe20;
  size_t line_num;
  const_string *in_stack_fffffffffffffe30;
  unit_test_log_t *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe80;
  undefined1 local_168 [16];
  undefined1 local_158 [104];
  undefined1 *local_f0;
  FILE **local_e8;
  FILE *local_e0;
  undefined1 local_d8 [64];
  char local_98 [40];
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CHash256::CHash256((CHash256 *)in_stack_fffffffffffffdf8);
  local_e0 = (FILE *)0x0;
  pcVar3 = getenv("ARGS_MERGE_TEST_OUT");
  if (pcVar3 != (char *)0x0) {
    fs::path::path((path *)0x39a3d7,in_stack_fffffffffffffdf8);
    local_e0 = fsbridge::fopen(local_98,"w");
    fs::path::~path((path *)in_stack_fffffffffffffdf8);
    if (local_e0 == (FILE *)0x0) {
      uVar4 = __cxa_allocate_exception(0x20);
      __errno_location();
      std::_V2::generic_category();
      std::system_error::system_error
                ((system_error *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe14,(error_category *)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      goto LAB_0039a7fa;
    }
  }
  local_f0 = local_70;
  local_e8 = &local_e0;
  ArgsMergeTestingSetup::ForEachMergeSetup<argsman_tests::util_ArgsMerge::test_method()::__0>
            ((ArgsMergeTestingSetup *)in_stack_fffffffffffffdf8,(anon_class_24_3_7a80ae05 *)0x39a515
            );
  if (local_e0 != (FILE *)0x0) {
    iVar2 = fclose(local_e0);
    if (iVar2 != 0) {
      uVar4 = __cxa_allocate_exception(0x20);
      __errno_location();
      std::_V2::generic_category();
      std::system_error::system_error
                ((system_error *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 in_stack_fffffffffffffe14,(error_category *)in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      goto LAB_0039a7fa;
    }
    local_e0 = (FILE *)0x0;
  }
  Span<unsigned_char>::Span<32>
            ((Span<unsigned_char> *)in_stack_fffffffffffffdf8,(uchar (*) [32])0x39a5f2);
  output.m_data._4_4_ = in_stack_fffffffffffffe14;
  output.m_data._0_4_ = in_stack_fffffffffffffe10;
  output.m_size._0_7_ = in_stack_fffffffffffffe18;
  output.m_size._7_1_ = in_stack_fffffffffffffe1f;
  CHash256::Finalize((CHash256 *)in_stack_fffffffffffffe08,output);
  Span<const_unsigned_char>::Span<32>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffdf8,(uchar (*) [32])0x39a624);
  s.m_size = (size_t)pcVar3;
  s.m_data = in_stack_fffffffffffffe80;
  HexStr_abi_cxx11_(s);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,line_num,
               (const_string *)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe20 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe00,(char (*) [1])in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (unsigned_long)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe08 =
         "\"f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473\"";
    in_stack_fffffffffffffe00 = "f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473";
    in_stack_fffffffffffffdf8 = "out_sha_hex";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
              (local_158,local_168,0x39c,1,2,local_d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0039a7fa:
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_ArgsMerge, ArgsMergeTestingSetup)
{
    CHash256 out_sha;
    FILE* out_file = nullptr;
    if (const char* out_path = getenv("ARGS_MERGE_TEST_OUT")) {
        out_file = fsbridge::fopen(out_path, "w");
        if (!out_file) throw std::system_error(errno, std::generic_category(), "fopen failed");
    }

    ForEachMergeSetup([&](const ActionList& arg_actions, const ActionList& conf_actions, bool soft_set, bool force_set,
                          const std::string& section, const std::string& network, bool net_specific) {
        TestArgsManager parser;
        LOCK(parser.cs_args);

        std::string desc = "net=";
        desc += network;
        parser.m_network = network;

        const std::string& name = net_specific ? "wallet" : "server";
        const std::string key = "-" + name;
        parser.AddArg(key, name, ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
        if (net_specific) parser.SetNetworkOnlyArg(key);

        auto args = GetValues(arg_actions, section, name, "a");
        std::vector<const char*> argv = {"ignored"};
        for (auto& arg : args) {
            arg.insert(0, "-");
            desc += " ";
            desc += arg;
            argv.push_back(arg.c_str());
        }
        std::string error;
        BOOST_CHECK(parser.ParseParameters(argv.size(), argv.data(), error));
        BOOST_CHECK_EQUAL(error, "");

        std::string conf;
        for (auto& conf_val : GetValues(conf_actions, section, name, "c")) {
            desc += " ";
            desc += conf_val;
            conf += conf_val;
            conf += "\n";
        }
        std::istringstream conf_stream(conf);
        BOOST_CHECK(parser.ReadConfigStream(conf_stream, "filepath", error));
        BOOST_CHECK_EQUAL(error, "");

        if (soft_set) {
            desc += " soft";
            parser.SoftSetArg(key, "soft1");
            parser.SoftSetArg(key, "soft2");
        }

        if (force_set) {
            desc += " force";
            parser.ForceSetArg(key, "force1");
            parser.ForceSetArg(key, "force2");
        }

        desc += " || ";

        if (!parser.IsArgSet(key)) {
            desc += "unset";
            BOOST_CHECK(!parser.IsArgNegated(key));
            BOOST_CHECK_EQUAL(parser.GetArg(key, "default"), "default");
            BOOST_CHECK(parser.GetArgs(key).empty());
        } else if (parser.IsArgNegated(key)) {
            desc += "negated";
            BOOST_CHECK_EQUAL(parser.GetArg(key, "default"), "0");
            BOOST_CHECK(parser.GetArgs(key).empty());
        } else {
            desc += parser.GetArg(key, "default");
            desc += " |";
            for (const auto& arg : parser.GetArgs(key)) {
                desc += " ";
                desc += arg;
            }
        }

        std::set<std::string> ignored = parser.GetUnsuitableSectionOnlyArgs();
        if (!ignored.empty()) {
            desc += " | ignored";
            for (const auto& arg : ignored) {
                desc += " ";
                desc += arg;
            }
        }

        desc += "\n";

        out_sha.Write(MakeUCharSpan(desc));
        if (out_file) {
            BOOST_REQUIRE(fwrite(desc.data(), 1, desc.size(), out_file) == desc.size());
        }
    });

    if (out_file) {
        if (fclose(out_file)) throw std::system_error(errno, std::generic_category(), "fclose failed");
        out_file = nullptr;
    }

    unsigned char out_sha_bytes[CSHA256::OUTPUT_SIZE];
    out_sha.Finalize(out_sha_bytes);
    std::string out_sha_hex = HexStr(out_sha_bytes);

    // If check below fails, should manually dump the results with:
    //
    //   ARGS_MERGE_TEST_OUT=results.txt ./test_bitcoin --run_test=argsman_tests/util_ArgsMerge
    //
    // And verify diff against previous results to make sure the changes are expected.
    //
    // Results file is formatted like:
    //
    //   <input> || <IsArgSet/IsArgNegated/GetArg output> | <GetArgs output> | <GetUnsuitable output>
    BOOST_CHECK_EQUAL(out_sha_hex, "f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473");
}